

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

ssize_t __thiscall inja::Environment::write(Environment *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream file;
  
  std::operator+(&local_240,
                 &((this->m_impl)._M_t.
                   super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
                   .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl)->
                  output_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__n);
  std::ofstream::ofstream(&file,(string *)&local_240,_S_out);
  std::__cxx11::string::~string((string *)&local_240);
  render(&local_240,this,(Template *)CONCAT44(in_register_00000034,__fd),(json *)__buf);
  std::operator<<((ostream *)&file,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::ofstream::close();
  sVar1 = std::ofstream::~ofstream(&file);
  return sVar1;
}

Assistant:

void write(const Template& temp, const json& data, const std::string& filename_out) {
		std::ofstream file(m_impl->output_path + filename_out);
		file << render(temp, data);
		file.close();
	}